

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,MessageLite *extendee,int number,Extension *other_extension,
          Arena *other_arena)

{
  FieldDescriptor *pFVar1;
  CppType CVar2;
  int iVar3;
  Extension *dst_extension;
  char *failure_msg;
  anon_union_8_9_fdc4a54a_for_Extension_0 other;
  undefined4 extraout_var;
  MessageLite *pMVar4;
  Extension *pEVar5;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar6;
  FieldType local_49;
  LogMessageFatal local_48;
  MessageLite *local_38;
  MessageLite *this_00;
  
  pFVar1 = other_extension->descriptor;
  pEVar5 = other_extension;
  local_38 = extendee;
  pVar6 = Insert(this,number);
  dst_extension = pVar6.first;
  dst_extension->descriptor = pFVar1;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    InternalExtensionMergeFromIntoUninitializedExtension
              (this,dst_extension,pVar6._8_8_,(int)pEVar5,other_extension,other_arena);
    return;
  }
  if (other_extension->is_repeated == true) {
    local_48.super_LogMessage.errno_saver_.saved_errno_._0_1_ = dst_extension->type;
    local_49 = other_extension->type;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_char,unsigned_char>
                            ((uchar *)&local_48,&local_49,
                             "dst_extension->type == other_extension.type");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                              (&dst_extension->is_packed,&other_extension->is_packed,
                               "dst_extension->is_packed == other_extension.is_packed");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        if (dst_extension->is_repeated != false) {
          CVar2 = anon_unknown_59::cpp_type(other_extension->type);
          switch(CVar2) {
          case CPPTYPE_INT32:
          case CPPTYPE_ENUM:
            RepeatedField<int>::MergeFrom
                      ((RepeatedField<int> *)dst_extension->field_0,
                       (RepeatedField<int> *)other_extension->field_0);
            return;
          case CPPTYPE_INT64:
            RepeatedField<long>::MergeFrom
                      ((RepeatedField<long> *)dst_extension->field_0,
                       (RepeatedField<long> *)other_extension->field_0);
            return;
          case CPPTYPE_UINT32:
            RepeatedField<unsigned_int>::MergeFrom
                      ((RepeatedField<unsigned_int> *)dst_extension->field_0,
                       (RepeatedField<unsigned_int> *)other_extension->field_0);
            return;
          case CPPTYPE_UINT64:
            RepeatedField<unsigned_long>::MergeFrom
                      ((RepeatedField<unsigned_long> *)dst_extension->field_0,
                       (RepeatedField<unsigned_long> *)other_extension->field_0);
            return;
          case CPPTYPE_DOUBLE:
            RepeatedField<double>::MergeFrom
                      ((RepeatedField<double> *)dst_extension->field_0,
                       (RepeatedField<double> *)other_extension->field_0);
            return;
          case CPPTYPE_FLOAT:
            RepeatedField<float>::MergeFrom
                      ((RepeatedField<float> *)dst_extension->field_0,
                       (RepeatedField<float> *)other_extension->field_0);
            return;
          case CPPTYPE_BOOL:
            RepeatedField<bool>::MergeFrom
                      ((RepeatedField<bool> *)dst_extension->field_0,
                       (RepeatedField<bool> *)other_extension->field_0);
            return;
          case CPPTYPE_STRING:
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)dst_extension->field_0,
                        (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)other_extension->field_0);
            return;
          case CPPTYPE_MESSAGE:
            RepeatedPtrField<google::protobuf::MessageLite>::MergeFrom
                      ((RepeatedPtrField<google::protobuf::MessageLite> *)dst_extension->field_0,
                       (RepeatedPtrField<google::protobuf::MessageLite> *)other_extension->field_0);
            return;
          default:
            return;
          }
        }
        failure_msg = "dst_extension->is_repeated";
        iVar3 = 0x466;
      }
      else {
        iVar3 = 0x465;
      }
    }
    else {
      iVar3 = 0x464;
    }
LAB_00337127:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,iVar3,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_48);
  }
  if ((other_extension->field_0xa & 2) == 0) {
    dst_extension->field_0xa = dst_extension->field_0xa & 0xfd;
    CVar2 = anon_unknown_59::cpp_type(other_extension->type);
    switch(CVar2) {
    case CPPTYPE_INT32:
    case CPPTYPE_UINT32:
    case CPPTYPE_ENUM:
      (dst_extension->field_0).int32_t_value = (other_extension->field_0).int32_t_value;
      break;
    case CPPTYPE_INT64:
    case CPPTYPE_UINT64:
      dst_extension->field_0 = other_extension->field_0;
      break;
    case CPPTYPE_DOUBLE:
      dst_extension->field_0 = other_extension->field_0;
      break;
    case CPPTYPE_FLOAT:
      (dst_extension->field_0).int32_t_value = (other_extension->field_0).int32_t_value;
      break;
    case CPPTYPE_BOOL:
      (dst_extension->field_0).bool_value = (other_extension->field_0).bool_value;
      break;
    case CPPTYPE_STRING:
      std::__cxx11::string::_M_assign((string *)dst_extension->field_0);
      return;
    case CPPTYPE_MESSAGE:
      local_48.super_LogMessage.errno_saver_.saved_errno_._0_1_ = dst_extension->type;
      local_49 = other_extension->type;
      failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_char,unsigned_char>
                              ((uchar *)&local_48,&local_49,
                               "dst_extension->type == other_extension.type");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<bool,bool>
                                (&dst_extension->is_packed,&other_extension->is_packed,
                                 "dst_extension->is_packed == other_extension.is_packed");
        if (failure_msg == (Nullable<const_char_*>)0x0) {
          if (dst_extension->is_repeated == false) {
            this_00 = (MessageLite *)(dst_extension->field_0).int64_t_value;
            if ((other_extension->field_0xa & 4) == 0) {
              other = (anon_union_8_9_fdc4a54a_for_Extension_0)
                      (other_extension->field_0).int64_t_value;
              if ((dst_extension->field_0xa & 4) != 0) {
                iVar3 = (*this_00->_vptr_MessageLite[5])(this_00,other.int64_t_value,this->arena_);
                this_00 = (MessageLite *)CONCAT44(extraout_var,iVar3);
                other = other_extension->field_0;
              }
            }
            else {
              if ((dst_extension->field_0xa & 4) != 0) {
                pMVar4 = GetPrototypeForLazyMessage(this,local_38,number);
                (*this_00->_vptr_MessageLite[0x10])
                          (this_00,pMVar4,(other_extension->field_0).int64_t_value,this->arena_,
                           other_arena);
                return;
              }
              other.int64_t_value =
                   (**(code **)(**(long **)&(other_extension->field_0).int32_t_value + 0x18))
                             (*(long **)&(other_extension->field_0).int32_t_value,this_00,
                              other_arena);
            }
            MessageLite::CheckTypeAndMergeFrom(this_00,(MessageLite *)other);
            return;
          }
          failure_msg = "!dst_extension->is_repeated";
          iVar3 = 0x498;
        }
        else {
          iVar3 = 0x497;
        }
      }
      else {
        iVar3 = 0x496;
      }
      goto LAB_00337127;
    }
  }
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(const MessageLite* extendee,
                                              int number,
                                              const Extension& other_extension,
                                              Arena* other_arena) {
  Extension* dst_extension;
  bool is_new =
      MaybeNewExtension(number, other_extension.descriptor, &dst_extension);
  if (is_new) {
    InternalExtensionMergeFromIntoUninitializedExtension(
        *dst_extension, extendee, number, other_extension, other_arena);
    return;
  }
  if (other_extension.is_repeated) {
    ABSL_DCHECK_EQ(dst_extension->type, other_extension.type);
    ABSL_DCHECK_EQ(dst_extension->is_packed, other_extension.is_packed);
    ABSL_DCHECK(dst_extension->is_repeated);

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                       \
  case WireFormatLite::CPPTYPE_##UPPERCASE:                     \
    dst_extension->ptr.repeated_##LOWERCASE##_value->MergeFrom( \
        *other_extension.ptr.repeated_##LOWERCASE##_value);     \
    break;

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
    return;
  }

  if (other_extension.is_cleared) {
    return;
  }
  dst_extension->is_cleared = false;
  switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                 \
  case WireFormatLite::CPPTYPE_##UPPERCASE:                               \
    dst_extension->LOWERCASE##_value = other_extension.LOWERCASE##_value; \
    break;

    HANDLE_TYPE(INT32, int32_t);
    HANDLE_TYPE(INT64, int64_t);
    HANDLE_TYPE(UINT32, uint32_t);
    HANDLE_TYPE(UINT64, uint64_t);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(ENUM, enum);
#undef HANDLE_TYPE
    case WireFormatLite::CPPTYPE_STRING:
      dst_extension->ptr.string_value->assign(
          *other_extension.ptr.string_value);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE: {
      ABSL_DCHECK_EQ(dst_extension->type, other_extension.type);
      ABSL_DCHECK_EQ(dst_extension->is_packed, other_extension.is_packed);
      ABSL_DCHECK(!dst_extension->is_repeated);
      if (other_extension.is_lazy) {
        if (dst_extension->is_lazy) {
          dst_extension->ptr.lazymessage_value->MergeFrom(
              GetPrototypeForLazyMessage(extendee, number),
              *other_extension.ptr.lazymessage_value, arena_, other_arena);
        } else {
          dst_extension->ptr.message_value->CheckTypeAndMergeFrom(
              other_extension.ptr.lazymessage_value->GetMessage(
                  *dst_extension->ptr.message_value, other_arena));
        }
      } else {
        if (dst_extension->is_lazy) {
          dst_extension->ptr.lazymessage_value
              ->MutableMessage(*other_extension.ptr.message_value, arena_)
              ->CheckTypeAndMergeFrom(*other_extension.ptr.message_value);
        } else {
          dst_extension->ptr.message_value->CheckTypeAndMergeFrom(
              *other_extension.ptr.message_value);
        }
      }
      break;
    }
  }
}